

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O1

int iemgui_dialog(t_iemgui *iemgui,t_symbol **srl,int argc,t_atom *argv)

{
  char *__dest;
  t_iem_fstyle_flags tVar1;
  t_iem_fstyle_flags tVar2;
  t_symbol *ptVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  t_symbol *ptVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  t_float tVar14;
  t_float tVar15;
  t_float tVar16;
  t_float tVar17;
  t_float tVar18;
  t_float tVar19;
  char str [144];
  char local_c8 [152];
  
  tVar14 = atom_getfloatarg(5,argc,argv);
  tVar15 = atom_getfloatarg(10,argc,argv);
  tVar16 = atom_getfloatarg(0xb,argc,argv);
  tVar17 = atom_getfloatarg(0xc,argc,argv);
  tVar18 = atom_getfloatarg(0xd,argc,argv);
  uVar5 = iemgui_getcolorarg(0xe,argc,argv);
  uVar6 = iemgui_getcolorarg(0xf,argc,argv);
  uVar7 = iemgui_getcolorarg(0x10,argc,argv);
  tVar1 = iemgui->x_fsf;
  if (argv[7].a_type == A_FLOAT) {
    ptVar10 = gensym("empty");
LAB_0013224f:
    *srl = ptVar10;
  }
  else if (argv[7].a_type == A_SYMBOL) {
    ptVar10 = atom_getsymbolarg(7,argc,argv);
    goto LAB_0013224f;
  }
  if (argv[8].a_type == A_FLOAT) {
    ptVar10 = gensym("empty");
LAB_00132281:
    srl[1] = ptVar10;
  }
  else if (argv[8].a_type == A_SYMBOL) {
    ptVar10 = atom_getsymbolarg(8,argc,argv);
    goto LAB_00132281;
  }
  if (argv[9].a_type == A_FLOAT) {
    tVar19 = atom_getfloatarg(9,argc,argv);
    sprintf(local_c8,"%g",(double)tVar19);
    ptVar10 = gensym(local_c8);
LAB_001322e1:
    srl[2] = ptVar10;
  }
  else if (argv[9].a_type == A_SYMBOL) {
    ptVar10 = atom_getsymbolarg(9,argc,argv);
    goto LAB_001322e1;
  }
  iemgui->x_isa = (t_iem_init_symargs)((uint)iemgui->x_isa & 0xfffffffe | (uint)((int)tVar14 != 0));
  lVar11 = 0;
  do {
    ptVar10 = srl[lVar11];
    if ((ptVar10 == &s_ || ptVar10 == (t_symbol *)0x0) ||
       (iVar8 = strcmp(ptVar10->s_name,"empty"), iVar8 == 0)) {
      srl[lVar11] = &s_;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  iemgui_all_dollararg2sym(iemgui,srl);
  ptVar10 = iemgui->x_rcv;
  bVar12 = ptVar10 == (t_symbol *)0x0;
  bVar13 = ptVar10 == &s_;
  if (bVar13 || bVar12) {
    if (srl[1] == (t_symbol *)0x0 || srl[1] == &s_) {
      bVar4 = true;
      if (bVar13 || bVar12) goto LAB_001323cd;
      goto LAB_001323ae;
    }
  }
  else {
LAB_001323ae:
    if ((srl[1] != &s_ && srl[1] != (t_symbol *)0x0) &&
       ((((bVar4 = true, bVar13 || bVar12 || (ptVar3 = srl[1], ptVar10 == ptVar3)) ||
         (ptVar3 == (t_symbol *)0x0)) || (ptVar3 == &s_)))) goto LAB_001323cd;
  }
  bVar4 = false;
LAB_001323cd:
  if ((!bVar13 && !bVar12) && !bVar4) {
    pd_unbind((t_pd *)iemgui,ptVar10);
  }
  iemgui->x_snd = *srl;
  uVar9 = (uint)(*srl != &s_ && *srl != (t_symbol *)0x0) << 7;
  tVar2 = iemgui->x_fsf;
  iemgui->x_fsf = (t_iem_fstyle_flags)((uint)tVar2 & 0xffffff7f | uVar9);
  iemgui->x_rcv = srl[1];
  iemgui->x_fsf =
       (t_iem_fstyle_flags)
       ((uint)tVar2 & 0xffffff3f | uVar9 | (uint)(srl[1] != &s_ && srl[1] != (t_symbol *)0x0) << 6);
  iemgui->x_lab = srl[2];
  iemgui->x_lcol = uVar7 & 0xffffff;
  iemgui->x_fcol = uVar6 & 0xffffff;
  iemgui->x_bcol = uVar5 & 0xffffff;
  iemgui->x_ldx = (int)tVar15;
  iemgui->x_ldy = (int)tVar16;
  __dest = iemgui->x_font;
  if ((int)tVar17 == 2) {
    builtin_strncpy(__dest,"times",6);
    uVar5 = 2;
  }
  else if ((int)tVar17 == 1) {
    builtin_strncpy(__dest,"helvetica",10);
    uVar5 = 1;
  }
  else {
    strcpy(__dest,sys_font);
    uVar5 = 0;
  }
  iemgui->x_fsf = (t_iem_fstyle_flags)((uint)iemgui->x_fsf & 0xffffffc0 | uVar5);
  iVar8 = 4;
  if (4 < (int)tVar18) {
    iVar8 = (int)tVar18;
  }
  iemgui->x_fontsize = iVar8;
  if ((!bVar4) && (ptVar10 = iemgui->x_rcv, ptVar10 != &s_ && ptVar10 != (t_symbol *)0x0)) {
    pd_bind((t_pd *)iemgui,ptVar10);
  }
  iemgui_verify_snd_ne_rcv(iemgui);
  canvas_dirty(iemgui->x_glist,1.0);
  return (uint)tVar1 >> 7 & 1 | (uint)tVar1 >> 5 & 2;
}

Assistant:

int iemgui_dialog(t_iemgui *iemgui, t_symbol **srl, int argc, t_atom *argv)
{
    char str[144];
    int init = (int)atom_getfloatarg(5, argc, argv);
    int ldx = (int)atom_getfloatarg(10, argc, argv);
    int ldy = (int)atom_getfloatarg(11, argc, argv);
    int f = (int)atom_getfloatarg(12, argc, argv);
    int fs = (int)atom_getfloatarg(13, argc, argv);
    int bcol = (int)iemgui_getcolorarg(14, argc, argv);
    int fcol = (int)iemgui_getcolorarg(15, argc, argv);
    int lcol = (int)iemgui_getcolorarg(16, argc, argv);
    int rcv_changed=0, oldsndrcvable=0;
    int i;

    if(iemgui->x_fsf.x_rcv_able)
        oldsndrcvable |= IEM_GUI_OLD_RCV_FLAG;
    if(iemgui->x_fsf.x_snd_able)
        oldsndrcvable |= IEM_GUI_OLD_SND_FLAG;
    if(IS_A_SYMBOL(argv,7))
        srl[0] = atom_getsymbolarg(7, argc, argv);
    else if(IS_A_FLOAT(argv,7))
    {
        srl[0] = gensym("empty");
    }
    if(IS_A_SYMBOL(argv,8))
        srl[1] = atom_getsymbolarg(8, argc, argv);
    else if(IS_A_FLOAT(argv,8))
    {
        srl[1] = gensym("empty");
    }
    if(IS_A_SYMBOL(argv,9))
        srl[2] = atom_getsymbolarg(9, argc, argv);
    else if(IS_A_FLOAT(argv,9))
    {
        sprintf(str, "%g", atom_getfloatarg(9, argc, argv));
        srl[2] = gensym(str);
    }
    if(init != 0) init = 1;
    iemgui->x_isa.x_loadinit = init;
    for(i=0; i<3; i++)
        if(!srl_is_valid(srl[i]) || (!strcmp(srl[i]->s_name, "empty"))) srl[i] = &s_;

        /* expand dollargs
         * after this, srl holds the $-expanded versions of the labels
         * and iemgui->x_(snd|rcv|lab)_unexpanded hold the unexpanded versions
         */
    iemgui_all_dollararg2sym(iemgui, srl);

        /* check if the receiver changed */
    if(0
       || (!srl_is_valid(iemgui->x_rcv) && srl_is_valid(srl[1])) /* there was none, but now there is */
       || ( srl_is_valid(iemgui->x_rcv) && !(srl_is_valid(srl[1]))) /* there was one, but now there is */
       || ( srl_is_valid(iemgui->x_rcv) && srl_is_valid(srl[1]) && iemgui->x_rcv != srl[1])) /* both are valid, but changed */
        rcv_changed = 1;

        /* if the receiver changed (and was previously set), unbind it */
    if(rcv_changed && srl_is_valid(iemgui->x_rcv))
        pd_unbind(&iemgui->x_obj.ob_pd, iemgui->x_rcv);

    iemgui->x_snd = srl[0];
    iemgui->x_fsf.x_snd_able = srl_is_valid(srl[0]);
    iemgui->x_rcv = srl[1];
    iemgui->x_fsf.x_rcv_able = srl_is_valid(srl[1]);
    iemgui->x_lab = srl[2];
    iemgui->x_lcol = lcol & 0xffffff;
    iemgui->x_fcol = fcol & 0xffffff;
    iemgui->x_bcol = bcol & 0xffffff;
    iemgui->x_ldx = ldx;
    iemgui->x_ldy = ldy;
    if(f == 1) strcpy(iemgui->x_font, "helvetica");
    else if(f == 2) strcpy(iemgui->x_font, "times");
    else
    {
        f = 0;
        strcpy(iemgui->x_font, sys_font);
    }
    iemgui->x_fsf.x_font_style = f;
    if(fs < 4)
        fs = 4;
    iemgui->x_fontsize = fs;

        /* if the receiver changed (and is now set), bind it */
    if(rcv_changed && srl_is_valid(iemgui->x_rcv))
        pd_bind(&iemgui->x_obj.ob_pd, iemgui->x_rcv);

    iemgui_verify_snd_ne_rcv(iemgui);
    canvas_dirty(iemgui->x_glist, 1);
    return(oldsndrcvable);
}